

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

Status __thiscall leveldb::TableBuilder::Finish(TableBuilder *this)

{
  Rep *options;
  Comparator *pCVar1;
  WritableFile *pWVar2;
  bool bVar3;
  long lVar4;
  TableBuilder *in_RSI;
  Slice local_1d8;
  Status local_1c8;
  string local_1c0 [8];
  string footer_encoding;
  undefined1 local_1a0 [8];
  Footer footer;
  Slice local_170;
  string local_160 [8];
  string handle_encoding_1;
  Slice local_140;
  Slice local_130;
  string local_120 [8];
  string handle_encoding;
  allocator local_e9;
  string local_e8 [8];
  string key;
  undefined1 local_c8 [8];
  BlockBuilder meta_index_block;
  undefined1 local_50 [8];
  BlockHandle index_block_handle;
  BlockHandle metaindex_block_handle;
  BlockHandle filter_block_handle;
  Rep *r;
  TableBuilder *this_local;
  
  options = in_RSI->rep_;
  Flush(in_RSI);
  if (((options->closed ^ 0xffU) & 1) != 0) {
    options->closed = true;
    BlockHandle::BlockHandle((BlockHandle *)&metaindex_block_handle.size_);
    BlockHandle::BlockHandle((BlockHandle *)&index_block_handle.size_);
    BlockHandle::BlockHandle((BlockHandle *)local_50);
    bVar3 = ok(in_RSI);
    if ((bVar3) && (options->filter_block != (FilterBlockBuilder *)0x0)) {
      join_0x00000010_0x00000000_ = FilterBlockBuilder::Finish(options->filter_block);
      WriteRawBlock(in_RSI,(Slice *)&meta_index_block.field_0x60,kNoCompression,
                    (BlockHandle *)&metaindex_block_handle.size_);
    }
    bVar3 = ok(in_RSI);
    if (bVar3) {
      BlockBuilder::BlockBuilder((BlockBuilder *)local_c8,&options->options);
      if (options->filter_block != (FilterBlockBuilder *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e8,"filter.",&local_e9);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        (*((options->options).filter_policy)->_vptr_FilterPolicy[2])();
        std::__cxx11::string::append((char *)local_e8);
        std::__cxx11::string::string(local_120);
        BlockHandle::EncodeTo((BlockHandle *)&metaindex_block_handle.size_,(string *)local_120);
        Slice::Slice(&local_130,(string *)local_e8);
        Slice::Slice(&local_140,(string *)local_120);
        BlockBuilder::Add((BlockBuilder *)local_c8,&local_130,&local_140);
        std::__cxx11::string::~string(local_120);
        std::__cxx11::string::~string(local_e8);
      }
      WriteBlock(in_RSI,(BlockBuilder *)local_c8,(BlockHandle *)&index_block_handle.size_);
      BlockBuilder::~BlockBuilder((BlockBuilder *)local_c8);
    }
    bVar3 = ok(in_RSI);
    if (bVar3) {
      if ((options->pending_index_entry & 1U) != 0) {
        pCVar1 = (options->options).comparator;
        (*pCVar1->_vptr_Comparator[5])(pCVar1,&options->last_key);
        std::__cxx11::string::string(local_160);
        BlockHandle::EncodeTo(&options->pending_handle,(string *)local_160);
        Slice::Slice(&local_170,&options->last_key);
        Slice::Slice((Slice *)&footer.index_handle_.size_,(string *)local_160);
        BlockBuilder::Add(&options->index_block,&local_170,(Slice *)&footer.index_handle_.size_);
        options->pending_index_entry = false;
        std::__cxx11::string::~string(local_160);
      }
      WriteBlock(in_RSI,&options->index_block,(BlockHandle *)local_50);
    }
    bVar3 = ok(in_RSI);
    if (bVar3) {
      Footer::Footer((Footer *)local_1a0);
      Footer::set_metaindex_handle((Footer *)local_1a0,(BlockHandle *)&index_block_handle.size_);
      Footer::set_index_handle((Footer *)local_1a0,(BlockHandle *)local_50);
      std::__cxx11::string::string(local_1c0);
      Footer::EncodeTo((Footer *)local_1a0,(string *)local_1c0);
      pWVar2 = options->file;
      Slice::Slice(&local_1d8,(string *)local_1c0);
      (*pWVar2->_vptr_WritableFile[2])(&local_1c8,pWVar2,&local_1d8);
      Status::operator=(&options->status,&local_1c8);
      Status::~Status(&local_1c8);
      bVar3 = Status::ok(&options->status);
      if (bVar3) {
        lVar4 = std::__cxx11::string::size();
        options->offset = lVar4 + options->offset;
      }
      std::__cxx11::string::~string(local_1c0);
    }
    Status::Status((Status *)this,&options->status);
    return (Status)(char *)this;
  }
  __assert_fail("!r->closed",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                ,0xc9,"Status leveldb::TableBuilder::Finish()");
}

Assistant:

Status TableBuilder::Finish() {
  Rep* r = rep_;
  Flush();
  assert(!r->closed);
  r->closed = true;

  BlockHandle filter_block_handle, metaindex_block_handle, index_block_handle;

  // Write filter block
  if (ok() && r->filter_block != nullptr) {
    WriteRawBlock(r->filter_block->Finish(), kNoCompression,
                  &filter_block_handle);
  }

  // Write metaindex block
  if (ok()) {
    BlockBuilder meta_index_block(&r->options);
    if (r->filter_block != nullptr) {
      // Add mapping from "filter.Name" to location of filter data
      std::string key = "filter.";
      key.append(r->options.filter_policy->Name());
      std::string handle_encoding;
      filter_block_handle.EncodeTo(&handle_encoding);
      meta_index_block.Add(key, handle_encoding);
    }

    // TODO(postrelease): Add stats and other meta blocks
    WriteBlock(&meta_index_block, &metaindex_block_handle);
  }

  // Write index block
  if (ok()) {
    if (r->pending_index_entry) {
      r->options.comparator->FindShortSuccessor(&r->last_key);
      std::string handle_encoding;
      r->pending_handle.EncodeTo(&handle_encoding);
      r->index_block.Add(r->last_key, Slice(handle_encoding));
      r->pending_index_entry = false;
    }
    WriteBlock(&r->index_block, &index_block_handle);
  }

  // Write footer
  if (ok()) {
    Footer footer;
    footer.set_metaindex_handle(metaindex_block_handle);
    footer.set_index_handle(index_block_handle);
    std::string footer_encoding;
    footer.EncodeTo(&footer_encoding);
    r->status = r->file->Append(footer_encoding);
    if (r->status.ok()) {
      r->offset += footer_encoding.size();
    }
  }
  return r->status;
}